

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O0

void generate_convert_field
               (dill_stream c,ConvStatus conv_status,dill_reg src_addr,size_t src_offset,
               dill_reg dest_addr,size_t dest_offset,dill_reg rt_conv_status,IOconvFieldStruct *conv
               ,FMTypeDesc *type_desc,int data_already_copied)

{
  row_column_swap_type rVar1;
  FMdata_type FVar2;
  int iVar3;
  undefined8 *puVar4;
  _FMgetFieldStruct tmp_spec_00;
  _FMgetFieldStruct tmp_spec_01;
  _FMgetFieldStruct tmp_spec_02;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined5 uVar10;
  undefined4 uVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  ssize_t sVar16;
  char *pcVar17;
  ssize_t sVar18;
  undefined8 in_RCX;
  undefined4 in_EDX;
  ConvStatus in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  void *in_R9;
  dill_reg unaff_retaddr;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  IOconvFieldStruct *in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  dill_reg tmp_dest_1;
  dill_reg tmp_src_1;
  int field_1;
  dill_reg addr_reg_1;
  int i;
  FMTypeDesc *next_1;
  FMdata_type dest_type;
  int dimen_count;
  int source_column_major;
  dill_reg tmp;
  dill_reg spec_reg;
  dill_reg spec;
  dill_reg dimen_reg;
  dill_reg dimens;
  _FMgetFieldStruct tmp_spec_4;
  int array_of_pointers;
  dill_reg delta;
  dill_reg dest_src_ptr;
  dill_reg size;
  int base_size;
  ssize_t base_delta;
  int field;
  dill_reg val;
  dill_reg addr_reg;
  dill_reg tmp_dest;
  dill_reg tmp_src;
  int loop_end;
  int loop_head;
  int loop_var_type;
  dill_reg loop_var;
  FMTypeDesc *next;
  _FMgetFieldStruct tmp_spec_3;
  int static_elements;
  _FMgetFieldStruct tmp_spec_2;
  dill_reg new_dest_1;
  dill_reg new_src_1;
  dill_reg reg_rt_conv_status;
  dill_reg new_dest;
  dill_reg new_src;
  char *name;
  FFSTypeHandle_conflict subformat;
  int null_target_1;
  _FMgetFieldStruct tmp_spec_1;
  dill_reg actual_dest_reg_1;
  dill_reg actual_src_reg_1;
  dill_reg tmp_dest_reg;
  dill_reg tmp_src_reg;
  int null_target;
  _FMgetFieldStruct tmp_spec;
  dill_reg actual_dest_reg;
  dill_reg actual_src_reg;
  undefined8 in_stack_fffffffffffffd88;
  ulong uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  void *in_stack_fffffffffffffd90;
  IOconvFieldStruct *pIVar23;
  int *in_stack_fffffffffffffd98;
  int *piVar24;
  void *in_stack_fffffffffffffda0;
  ulong uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined8 in_stack_fffffffffffffda8;
  int *piVar28;
  undefined4 local_1bc;
  undefined4 local_1b8;
  uint local_1ac;
  undefined8 *local_1a8;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_188;
  size_t local_180;
  undefined8 local_178;
  undefined8 local_170;
  uint local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  int local_154;
  undefined8 in_stack_fffffffffffffeb0;
  dill_reg dVar29;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  dill_reg in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int local_124;
  FMdata_type in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  size_t in_stack_fffffffffffffee8;
  dill_reg in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  dill_stream in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar30;
  dill_reg in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  dill_reg *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int local_d4;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int local_94;
  int local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  size_t local_80;
  undefined8 local_78;
  int *local_70;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  void *pvVar31;
  undefined4 in_stack_ffffffffffffffa8;
  dill_reg dVar32;
  undefined4 in_stack_ffffffffffffffb8;
  
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  dVar29 = (dill_reg)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  switch(*(undefined4 *)(CONCAT44(in_stack_0000001c,in_stack_00000018) + 8)) {
  case 0:
    local_80 = (in_stack_00000010->src_field).offset;
    local_78._0_4_ = (in_stack_00000010->src_field).size;
    local_78._4_4_ = (in_stack_00000010->src_field).data_type;
    local_70 = *(int **)&(in_stack_00000010->src_field).byte_swap;
    local_84 = dill_alloc_label(in_RDI,0);
    dVar32 = (dill_reg)((ulong)in_RCX >> 0x20);
    local_80 = 0;
    pvVar31 = in_R9;
    local_78._0_4_ = in_RSI->src_pointer_size;
    decode_size_delta(in_RSI,in_stack_00000010,
                      (FMTypeDesc *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    tmp_spec_00.offset._4_4_ = in_stack_fffffffffffffee4;
    tmp_spec_00.offset._0_4_ = in_stack_fffffffffffffee0;
    tmp_spec_00.size = (int)in_stack_fffffffffffffee8;
    tmp_spec_00.data_type = (int)(in_stack_fffffffffffffee8 >> 0x20);
    tmp_spec_00.byte_swap = (char)in_stack_fffffffffffffef0;
    tmp_spec_00.src_float_format = (char)((uint)in_stack_fffffffffffffef0 >> 8);
    tmp_spec_00.target_float_format = (char)((uint)in_stack_fffffffffffffef0 >> 0x10);
    tmp_spec_00._19_1_ = (char)((uint)in_stack_fffffffffffffef0 >> 0x18);
    tmp_spec_00._20_4_ = in_stack_fffffffffffffef4;
    piVar24 = local_70;
    iVar12 = (int)local_78;
    iVar3 = local_78._4_4_;
    gen_convert_address_field
              ((dill_stream)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               tmp_spec_00,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),dVar29,
               (size_t)in_stack_fffffffffffffef8,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
               (dill_reg *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
    ffs_getreg(in_R9,piVar24,iVar3,iVar12);
    ffs_getreg(in_R9,piVar24,iVar3,iVar12);
    (**(code **)(*in_RDI + 0xf8))(in_RDI,8,0,local_88,in_stack_ffffffffffffff9c);
    (**(code **)(*in_RDI + 0xf8))(in_RDI,8,0,local_8c,in_stack_ffffffffffffff98);
    ffs_putreg(in_RDI,in_stack_ffffffffffffff9c,8);
    ffs_putreg(in_RDI,in_stack_ffffffffffffff98,8);
    uVar21 = *(undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018);
    uVar19 = (ulong)in_stack_00000008;
    uVar25 = (ulong)(in_RSI->global_conv->conversion_type == direct_to_mem);
    generate_convert_field
              ((dill_stream)in_RSI,(ConvStatus)CONCAT44(in_EDX,in_stack_ffffffffffffffb8),dVar32,
               CONCAT44(in_R8D,in_stack_ffffffffffffffa8),(dill_reg)((ulong)pvVar31 >> 0x20),
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),unaff_retaddr,
               (IOconvFieldStruct *)CONCAT44(in_stack_0000000c,in_stack_00000008),
               (FMTypeDesc *)in_stack_00000010,in_stack_00000018);
    dill_mark_label(in_RDI,local_84);
    (**(code **)(*in_RDI + 0xd8))
              (in_RDI,8,0,in_stack_ffffffffffffff98,in_R8D,pvVar31,uVar19,in_stack_00000010,uVar21,
               uVar25);
    break;
  case 1:
    iVar12 = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    if (in_stack_00000010->rc_swap == no_row_column_swap) {
      iVar30 = 1;
      iVar3 = (in_stack_00000010->src_field).size;
      iVar15 = in_stack_00000018;
      uVar13 = in_stack_0000001c;
      while (*(int *)(CONCAT44(uVar13,iVar15) + 8) == 1) {
        if (*(int *)(CONCAT44(uVar13,iVar15) + 0x18) != 0) {
          iVar30 = *(int *)(CONCAT44(uVar13,iVar15) + 0x18) * iVar30;
        }
        puVar4 = (undefined8 *)CONCAT44(uVar13,iVar15);
        iVar15 = (int)*puVar4;
        uVar13 = (undefined4)((ulong)*puVar4 >> 0x20);
      }
      if (((((in_stack_00000020 == 0) || ((in_stack_00000010->src_field).byte_swap != '\0')) ||
           ((in_stack_00000010->src_field).src_float_format !=
            (in_stack_00000010->src_field).target_float_format)) ||
          (((in_stack_00000010->src_field).size != in_stack_00000010->dest_size ||
           (in_stack_00000010->subconversion != (IOConversionPtr)0x0)))) ||
         ((*(int *)(CONCAT44(uVar13,iVar15) + 8) == 0 ||
          ((*(int *)(CONCAT44(uVar13,iVar15) + 8) == 2 ||
           ((in_stack_00000010->src_field).data_type == string_type)))))) {
        ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,iVar12,
                   (int)in_stack_fffffffffffffd90);
        ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                   (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),(int)in_stack_fffffffffffffd90);
        (**(code **)(*in_RDI + 0xf8))(in_RDI,8,0,in_stack_fffffffffffffecc,in_EDX);
        (**(code **)(*in_RDI + 0xf8))(in_RDI,8,0,in_stack_fffffffffffffec8,in_R8D);
        if ((in_stack_00000010->subconversion == (IOConversionPtr)0x0) &&
           (iVar12 = debug_code_generation(), iVar12 == 0)) {
          iVar12 = ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                              (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                              (int)in_stack_fffffffffffffd90);
          if (iVar12 == 0) {
            fprintf(_stderr,"%s\n","gen field convert out of registers BB \n");
            exit(1);
          }
        }
        else {
          iVar12 = ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                              (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                              (int)in_stack_fffffffffffffd90);
          if (iVar12 == 0) {
            fprintf(_stderr,"%s\n","gen field convert out of registers CC\n");
            exit(1);
          }
        }
        (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                  (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                   (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_fffffffffffffecc,
                   in_stack_fffffffffffffecc,in_RCX);
        (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                  (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                   (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_fffffffffffffec8,
                   in_stack_fffffffffffffec8,in_R9);
        uVar13 = dill_alloc_label(in_RDI,0);
        uVar11 = dill_alloc_label(in_RDI,0);
        (**(code **)(*in_RDI + 0x100))(in_RDI,4,0,local_124,(long)iVar30);
        iVar12 = in_stack_00000018;
        while( true ) {
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
          dVar32 = (dill_reg)((ulong)in_RCX >> 0x20);
          dVar29 = (dill_reg)((ulong)in_R9 >> 0x20);
          if (*(int *)(CONCAT44(in_stack_0000001c,iVar12) + 8) != 1) break;
          if (*(int *)(CONCAT44(in_stack_0000001c,iVar12) + 0x18) == 0) {
            uVar14 = SUB84(in_RSI->control_value,0);
            iVar15 = *(int *)(CONCAT44(in_stack_0000001c,iVar12) + 0x1c);
            ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                       (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                       (int)in_stack_fffffffffffffd90);
            (**(code **)(*in_RDI + 0xc0))
                      (in_RDI,4,0,in_stack_fffffffffffffec0,uVar14,(long)iVar15 << 2);
            (**(code **)(*(long *)(*in_RDI + 0x30) + 0x40))
                      (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x38) + 0x20),
                       (int)*(short *)(*(long *)(*in_RDI + 0x38) + 0x22),local_124,local_124,
                       in_stack_fffffffffffffec0);
          }
          puVar4 = (undefined8 *)CONCAT44(in_stack_0000001c,iVar12);
          iVar12 = (int)*puVar4;
          in_stack_0000001c = (undefined4)((ulong)*puVar4 >> 0x20);
        }
        if (in_stack_00000020 == 0) {
          sVar18 = decode_size_delta(in_RSI,in_stack_00000010,
                                     (FMTypeDesc *)CONCAT44(in_stack_0000001c,iVar12));
          if (in_RSI->global_conv->conversion_type == copy_dynamic_portion) {
            local_154 = item_size(in_RSI,in_stack_00000010,
                                  (FMTypeDesc *)CONCAT44(in_stack_0000001c,iVar12));
            ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                       (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                       (int)in_stack_fffffffffffffd90);
            (**(code **)(*(long *)(*in_RDI + 0x40) + 0x40))
                      (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0x20),
                       (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0x22),local_158,local_124,
                       (long)local_154);
            uVar21 = CONCAT44(uVar14,local_158);
            dill_scallv(in_RDI,memcpy,"memcpy","%p%p%i",in_stack_fffffffffffffec8,
                        in_stack_fffffffffffffecc,uVar21);
            uVar14 = (undefined4)((ulong)uVar21 >> 0x20);
          }
          if (sVar18 != 0) {
            ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                       (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                       (int)in_stack_fffffffffffffd90);
            ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                       (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                       (int)in_stack_fffffffffffffd90);
            (**(code **)(*(long *)(*in_RDI + 0x40) + 0x40))
                      (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0x20),
                       (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0x22),local_160,local_124,sVar18)
            ;
            (**(code **)(*in_RDI + 0xc0))(in_RDI,8,0,local_15c,in_stack_00000008,8);
            (**(code **)(*(long *)(*in_RDI + 0x30) + 0x140))
                      (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x38) + 0xa0),
                       (int)*(short *)(*(long *)(*in_RDI + 0x38) + 0xa2),local_15c,local_15c,
                       local_160);
            (**(code **)(*in_RDI + 0xd8))(in_RDI,8,0,local_15c,in_stack_00000008,8);
          }
        }
        uVar26 = (undefined4)((ulong)in_stack_fffffffffffffda0 >> 0x20);
        iVar15 = debug_code_generation();
        if (iVar15 != 0) {
          uVar21 = CONCAT44(uVar14,local_124);
          dill_scallv(in_RDI,printf,"printf","%P%P%p","format %s, field Initial loopvar = %x\n",
                      in_RSI->global_conv->ioformat->body->format_name,uVar21);
          uVar14 = (undefined4)((ulong)uVar21 >> 0x20);
        }
        (**(code **)(*(long *)(*in_RDI + 0x80) + 0x128))
                  (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + 0x94),
                   (int)*(short *)(*(long *)(*in_RDI + 0x88) + 0x96),local_124,0,uVar11);
        dill_mark_label(in_RDI,uVar13);
        uVar21 = CONCAT44(in_stack_0000001c,iVar12);
        uVar22 = CONCAT44(uVar14,in_stack_00000008);
        uVar20 = CONCAT44(uVar26,in_stack_00000020);
        pIVar23 = in_stack_00000010;
        generate_convert_field
                  ((dill_stream)in_RSI,
                   (ConvStatus)CONCAT44(in_stack_fffffffffffffecc,in_stack_ffffffffffffffb8),dVar32,
                   CONCAT44(in_stack_fffffffffffffec8,in_stack_ffffffffffffffa8),dVar29,
                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),unaff_retaddr,
                   (IOconvFieldStruct *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                   (FMTypeDesc *)in_stack_00000010,in_stack_00000018);
        (**(code **)(*(long *)(*in_RDI + 0x40) + 0x20))
                  (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0x10),
                   (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0x12),local_124,local_124,1,uVar22,
                   pIVar23,uVar21,uVar20);
        local_164 = 0;
        if ((in_stack_00000010->iovar->type_desc).type == FMType_pointer) {
          local_164 = (uint)(((in_stack_00000010->iovar->type_desc).next)->next->type ==
                            FMType_pointer);
        }
        if (local_164 == 0) {
          (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                    (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                     (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_fffffffffffffecc,
                     in_stack_fffffffffffffecc,(long)iVar3);
          (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                    (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                     (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_fffffffffffffec8,
                     in_stack_fffffffffffffec8,(long)in_stack_00000010->dest_size);
        }
        else {
          (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                    (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                     (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_fffffffffffffecc,
                     in_stack_fffffffffffffecc,(long)in_RSI->src_pointer_size);
          (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                    (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                     (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_fffffffffffffec8,
                     in_stack_fffffffffffffec8,(long)in_RSI->target_pointer_size);
        }
        iVar12 = debug_code_generation();
        if (iVar12 != 0) {
          dill_scallv(in_RDI,printf,"printf","%P%p%p%p","loopvar = %x, src %x, dest %x\n",local_124,
                      in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
        }
        (**(code **)(*(long *)(*in_RDI + 0x80) + 0xd0))
                  (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + 0x68),
                   (int)*(short *)(*(long *)(*in_RDI + 0x88) + 0x6a),local_124,0,uVar13);
        dill_mark_label(in_RDI,uVar11);
        ffs_putreg(in_RDI,local_124,4);
      }
    }
    else {
      local_180 = (in_stack_00000010->src_field).offset;
      local_178._0_4_ = (in_stack_00000010->src_field).size;
      local_178._4_4_ = (in_stack_00000010->src_field).data_type;
      local_170._0_1_ = (in_stack_00000010->src_field).byte_swap;
      local_170._1_1_ = (in_stack_00000010->src_field).src_float_format;
      local_170._2_1_ = (in_stack_00000010->src_field).target_float_format;
      local_170._3_5_ = *(undefined5 *)&(in_stack_00000010->src_field).field_0x13;
      rVar1 = in_stack_00000010->rc_swap;
      iVar3 = in_stack_00000010->iovar->dimen_count;
      FVar2 = (in_stack_00000010->src_field).data_type;
      ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,iVar12,
                 (int)in_stack_fffffffffffffd90);
      ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),(int)in_stack_fffffffffffffd90);
      ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),(int)in_stack_fffffffffffffd90);
      iVar12 = ffs_localb(in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20))
      ;
      iVar15 = ffs_localb(in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20))
      ;
      dill_virtual_lea(in_RDI,local_188,iVar12);
      dill_virtual_lea(in_RDI,local_190,iVar15);
      local_1ac = 0;
      for (local_1a8 = (undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018);
          *(int *)(local_1a8 + 1) == 1; local_1a8 = (undefined8 *)*local_1a8) {
        if (*(int *)(local_1a8 + 3) == 0) {
          (**(code **)(*in_RDI + 0xc0))
                    (in_RDI,4,0,local_194,(ulong)in_RSI->control_value & 0xffffffff,
                     (long)*(int *)((long)local_1a8 + 0x1c) << 2);
        }
        else {
          (**(code **)(*in_RDI + 0x100))(in_RDI,4,0,local_194,(long)*(int *)(local_1a8 + 3));
        }
        (**(code **)(*in_RDI + 0xd8))(in_RDI,4,0,local_194,local_188,(long)(int)local_1ac << 2);
        local_1ac = local_1ac + 1;
      }
      (**(code **)(*in_RDI + 0x100))(in_RDI,4,0,local_194,0);
      (**(code **)(*in_RDI + 0xd8))(in_RDI,4,0,local_194,local_188,(long)iVar3 << 2);
      (**(code **)(*in_RDI + 0xd8))(in_RDI,4,0,local_194,local_190,0);
      local_1ac = 4;
      while( true ) {
        uVar11 = (undefined4)((ulong)in_stack_fffffffffffffda8 >> 0x20);
        uVar13 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
        if (0x17 < local_1ac) break;
        (**(code **)(*in_RDI + 0x100))
                  (in_RDI,4,0,local_194,(long)*(int *)((long)&local_180 + (long)(int)local_1ac));
        (**(code **)(*in_RDI + 0xd8))(in_RDI,4,0,local_194,local_190,(long)(int)local_1ac);
        local_1ac = local_1ac + 4;
      }
      ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),(int)in_stack_fffffffffffffd90);
      ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),(int)in_stack_fffffffffffffd90);
      uVar27 = (undefined4)((ulong)in_stack_fffffffffffffda0 >> 0x20);
      uVar26 = (undefined4)((ulong)in_stack_fffffffffffffd98 >> 0x20);
      uVar14 = (undefined4)((ulong)in_stack_fffffffffffffd90 >> 0x20);
      (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                 (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),local_1b8,in_EDX,in_RCX);
      (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                 (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),local_1bc,in_R8D,in_R9);
      dill_scallv(in_RDI,transpose_array,"transpose_array","%p%p%p%I%I%I%p",local_188,local_1b8,
                  CONCAT44(uVar13,local_1bc),
                  CONCAT44(uVar14,(uint)(rVar1 == swap_source_column_major)),CONCAT44(uVar26,FVar2),
                  CONCAT44(uVar27,in_stack_00000010->dest_size),CONCAT44(uVar11,local_190));
    }
    break;
  case 2:
    uVar21._0_4_ = (in_stack_00000010->src_field).size;
    uVar21._4_4_ = (in_stack_00000010->src_field).data_type;
    uVar22._0_1_ = (in_stack_00000010->src_field).byte_swap;
    uVar22._1_1_ = (in_stack_00000010->src_field).src_float_format;
    uVar22._2_1_ = (in_stack_00000010->src_field).target_float_format;
    uVar22._3_5_ = *(undefined5 *)&(in_stack_00000010->src_field).field_0x13;
    uVar11 = dill_alloc_label(in_RDI,0);
    sVar18 = in_RSI->src_offset_adjust;
    pvVar31 = in_R9;
    sVar16 = decode_size_delta(in_RSI,in_stack_00000010,
                               (FMTypeDesc *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    iVar12 = in_RSI->register_args;
    piVar24 = &local_90;
    piVar28 = &local_94;
    uVar20 = 0;
    tmp_spec_01.offset._4_4_ = in_stack_fffffffffffffee4;
    tmp_spec_01.offset._0_4_ = in_stack_fffffffffffffee0;
    tmp_spec_01.size = (int)in_stack_fffffffffffffee8;
    tmp_spec_01.data_type = (int)(in_stack_fffffffffffffee8 >> 0x20);
    tmp_spec_01.byte_swap = (char)in_stack_fffffffffffffef0;
    tmp_spec_01.src_float_format = (char)((uint)in_stack_fffffffffffffef0 >> 8);
    tmp_spec_01.target_float_format = (char)((uint)in_stack_fffffffffffffef0 >> 0x10);
    tmp_spec_01._19_1_ = (char)((uint)in_stack_fffffffffffffef0 >> 0x18);
    tmp_spec_01._20_4_ = in_stack_fffffffffffffef4;
    uVar13 = uVar11;
    gen_convert_address_field
              ((dill_stream)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               tmp_spec_01,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),dVar29,
               (size_t)in_stack_fffffffffffffef8,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
               (dill_reg *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
    if (in_stack_00000020 == 0) {
      dill_scallv(in_RDI,strcpy,"strcpy","%p%p",local_94,local_90,uVar20,uVar21,uVar22,in_R9,sVar18,
                  in_stack_00000008,sVar16,piVar24,piVar28,iVar12,uVar13);
    }
    dill_mark_label(in_RDI,uVar11);
    (**(code **)(*in_RDI + 0xd8))(in_RDI,8,0,local_94,in_R8D,pvVar31);
    ffs_putreg(in_RDI,local_90,8);
    ffs_putreg(in_RDI,local_94,8);
    break;
  case 3:
    pcVar17 = FFSTypeHandle_name(in_stack_00000010->subconversion->ioformat);
    if (in_stack_00000010->subconversion->conv_func == (conv_routine)0x0) {
      in_RSI->global_conv->conv_pkg = (char *)0xffffffffffffffff;
    }
    iVar12 = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    if (in_RSI->register_args == 0) {
      iVar12 = ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,iVar12,
                          (int)in_stack_fffffffffffffd90);
      if ((iVar12 == 0) ||
         (iVar12 = ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                              (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                              (int)in_stack_fffffffffffffd90), iVar12 == 0)) {
        fprintf(_stderr,"%s\n","temp vals in subcall\n");
        exit(1);
      }
      iVar12 = ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                          (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                          (int)in_stack_fffffffffffffd90);
      if (iVar12 == 0) {
        fprintf(_stderr,"%s\n","temp string vals in subcall\n");
        exit(1);
      }
      (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                 (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_ffffffffffffff28,in_EDX,
                 in_RCX);
      (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                 (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_ffffffffffffff24,in_R8D,
                 in_R9);
      (**(code **)(*in_RDI + 0xc0))(in_RDI,8,0,local_d4,(int)in_RDI[2],(long)(int)in_stack_00000008)
      ;
      dill_scallp(in_RDI,in_stack_00000010->subconversion->conv_func,pcVar17,"%p%p%p",
                  in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,CONCAT44(uVar13,local_d4));
      ffs_putreg(in_RDI,local_d4,8);
    }
    else {
      iVar12 = ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,iVar12,
                          (int)in_stack_fffffffffffffd90);
      if ((iVar12 == 0) ||
         (iVar12 = ffs_getreg(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                              (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                              (int)in_stack_fffffffffffffd90), iVar12 == 0)) {
        fprintf(_stderr,"%s\n","temp vals in subcall\n");
        exit(1);
      }
      (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                 (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_ffffffffffffff34,in_EDX,
                 in_RCX);
      (**(code **)(*(long *)(*in_RDI + 0x40) + 0x140))
                (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa0),
                 (int)*(short *)(*(long *)(*in_RDI + 0x48) + 0xa2),in_stack_ffffffffffffff30,in_R8D,
                 in_R9);
      dill_scallp(in_RDI,in_stack_00000010->subconversion->conv_func,pcVar17,"%p%p%p",
                  in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                  CONCAT44(uVar13,in_stack_00000008));
      debug_code_generation();
      ffs_putreg(in_RDI,in_stack_ffffffffffffff34,8);
      ffs_putreg(in_RDI,in_stack_ffffffffffffff30,8);
    }
    break;
  case 4:
    uVar5 = (in_stack_00000010->src_field).size;
    uVar6 = (in_stack_00000010->src_field).data_type;
    uVar7 = (in_stack_00000010->src_field).byte_swap;
    uVar8 = (in_stack_00000010->src_field).src_float_format;
    uVar9 = (in_stack_00000010->src_field).target_float_format;
    uVar10 = *(undefined5 *)&(in_stack_00000010->src_field).field_0x13;
    tmp_spec_02._11_5_ = uVar10;
    tmp_spec_02.size._2_1_ = uVar9;
    tmp_spec_02.size._1_1_ = uVar8;
    tmp_spec_02.size._0_1_ = uVar7;
    tmp_spec_02.offset._4_4_ = uVar6;
    tmp_spec_02.offset._0_4_ = uVar5;
    tmp_spec_02._16_4_ = in_stack_ffffffffffffff20;
    tmp_spec_02._20_4_ = in_stack_ffffffffffffff24;
    gen_simple_field_conv
              (in_stack_fffffffffffffef8,tmp_spec_02,in_stack_fffffffffffffef4,
               in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
               in_stack_fffffffffffffee0,in_stack_ffffffffffffff28,
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  return;
}

Assistant:

static void
generate_convert_field(dill_stream c, ConvStatus conv_status, dill_reg src_addr,
		       size_t src_offset, dill_reg dest_addr, size_t dest_offset,
		       dill_reg rt_conv_status, IOconvFieldStruct *conv, FMTypeDesc *type_desc,
		       int data_already_copied)
{
    switch(type_desc->type) {
    case FMType_pointer: {
	dill_reg actual_src_reg, actual_dest_reg;
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	int null_target = dill_alloc_label(c, NULL);
	tmp_spec.offset = 0;
	tmp_spec.size = conv_status->src_pointer_size;
	
	gen_convert_address_field(c, tmp_spec, 0, src_addr, src_offset,
				  conv_status->target_pointer_size, 
				  dest_addr, dest_offset, 
				  conv_status->src_offset_adjust, 
				  rt_conv_status,
				  decode_size_delta(conv_status, conv, type_desc),
				  &actual_src_reg, &actual_dest_reg, 
				  conv_status->register_args, null_target);
	{
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);
	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#else
	    dill_reg tmp_src_reg, tmp_dest_reg;
	    ffs_getreg(c, &tmp_dest_reg, DILL_P, DILL_VAR);
	    ffs_getreg(c, &tmp_src_reg, DILL_P, DILL_VAR);
#endif
	    dill_movp(c, tmp_src_reg, actual_src_reg);
	    dill_movp(c, tmp_dest_reg, actual_dest_reg);
	    REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		       actual_src_reg, actual_dest_reg));
	    ffs_putreg(c, actual_src_reg, DILL_P);
	    ffs_putreg(c, actual_dest_reg, DILL_P);
	    generate_convert_field(c, conv_status, tmp_src_reg, 0, 
				   tmp_dest_reg, 0, rt_conv_status,
				   conv, type_desc->next, conv_status->global_conv->conversion_type == direct_to_mem);
	    
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	}
	dill_mark_label(c, null_target);
	
#ifdef VERBOSE
	dill_scallv(c, (void*)printf, "printf", "%P%p",
		    "storing POINTER value %p\n",actual_dest_reg);
#endif
	dill_stpi(c, actual_dest_reg, dest_addr, dest_offset);

	break;
    }
    case FMType_string:{
	dill_reg actual_src_reg, actual_dest_reg;
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	tmp_spec.offset = 0;
	int null_target = dill_alloc_label(c, NULL);
	gen_convert_address_field(c, tmp_spec, 0, src_addr, src_offset,
				  conv->dest_size, dest_addr, dest_offset, 
				  conv_status->src_offset_adjust, 
				  rt_conv_status,
				  decode_size_delta(conv_status, conv, type_desc),
				  &actual_src_reg, &actual_dest_reg, 
				  conv_status->register_args, null_target);
	/* generate strcpy */
	if (!data_already_copied) {
#ifdef VERBOSE
	    dill_scallv(c, (void*)printf, "printf", "%P%p%p",
			"Calling Strcpy with args %p, %p\n",actual_dest_reg, actual_src_reg);

#endif
	    dill_scallv(c, (void*)strcpy, "strcpy", "%p%p", actual_dest_reg, actual_src_reg);

	}
	dill_mark_label(c, null_target);
	
	dill_stpi(c, actual_dest_reg, dest_addr, dest_offset);
	REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		   actual_src_reg, actual_dest_reg));
	ffs_putreg(c, actual_src_reg, DILL_P);
	ffs_putreg(c, actual_dest_reg, DILL_P);
	break;
    }
    case FMType_subformat: {
	FFSTypeHandle subformat = conv->subconversion->ioformat;
	char *name = FFSTypeHandle_name(subformat);
	if (conv->subconversion->conv_func == NULL) {
	    /* we're not linking to an address that's valid, 
	       must fill it in later */
	    conv_status->global_conv->conv_pkg = (char *) -1;
	}
	    
	if (conv_status->register_args) {
	    dill_reg new_src, new_dest;
	    if (!ffs_getreg(c, &new_src, DILL_P, DILL_TEMP) ||
		!ffs_getreg(c, &new_dest, DILL_P, DILL_TEMP))
		gen_fatal("temp vals in subcall\n");
	    REG_DEBUG(("Getting %d and %d for new src & dest\n", 
		       new_src, new_dest));
	    dill_addpi(c, new_src, src_addr, src_offset);
	    dill_addpi(c, new_dest, dest_addr, dest_offset);
	    (void) dill_scallp(c, (void*)conv->subconversion->conv_func, name, "%p%p%p", new_src,
			      new_dest, rt_conv_status);
	    REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		       new_src, new_dest));
	    if (debug_code_generation()) {
/*	        VCALL2V(printf, "%P%p",
	    "After subroutine call, new src_string_base is %p\n", src_string_base);*/
	    }
	    ffs_putreg(c, new_src, DILL_P);
	    ffs_putreg(c, new_dest, DILL_P);
	} else {
	    dill_reg reg_rt_conv_status;
	    dill_reg new_src, new_dest;
	    if (!ffs_getreg(c, &new_src, DILL_P, DILL_TEMP) ||
		!ffs_getreg(c, &new_dest, DILL_P, DILL_TEMP))
		gen_fatal("temp vals in subcall\n");
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);

	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#endif

	    if (!ffs_getreg(c, &reg_rt_conv_status, DILL_P, DILL_TEMP))
		gen_fatal("temp string vals in subcall\n");
	    REG_DEBUG(("Getting %d and %d for reg_rt_conv_status\n", reg_rt_conv_status));
	    dill_addpi(c, new_src, src_addr, src_offset);
	    dill_addpi(c, new_dest, dest_addr, dest_offset);
	    dill_ldpi(c, reg_rt_conv_status, dill_lp(c), rt_conv_status);
	    dill_scallp(c, (void*)conv->subconversion->conv_func, name, "%p%p%p", new_src,
			new_dest, reg_rt_conv_status);
	    REG_DEBUG(("Putting %d reg_rt_conv_status\n", reg_rt_conv_status));
	    ffs_putreg(c, reg_rt_conv_status, DILL_P);
	    /* restore values of src_addr and dest_addr */
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	}
	break;
    }
    case FMType_simple: {
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	tmp_spec.offset = 0;
	gen_simple_field_conv(c, tmp_spec, 
			      conv_status->global_conv->required_alignment, 
			      src_addr, src_offset, 
			      conv->dest_size, tmp_spec.data_type, 
			      dest_addr, dest_offset);
	break;
    }
    case FMType_array:
	if (conv->rc_swap == no_row_column_swap) {
	    int static_elements = 1;
	    struct _FMgetFieldStruct tmp_spec = conv->src_field;
	    FMTypeDesc *next = type_desc;
	    while (next->type == FMType_array) {
		if (next->static_size != 0) {
		    static_elements *= next->static_size;
		}
		next = next->next;
	    }
	
	    dill_reg loop_var;
	    int loop_var_type;

	    int loop_head, loop_end;
	    if (data_already_copied &&
		!conv->src_field.byte_swap &&
		(conv->src_field.src_float_format == conv->src_field.target_float_format) &&
		(conv->src_field.size == conv->dest_size) &&
		(conv->subconversion == NULL) &&
		(next->type != FMType_pointer) &&
		(next->type != FMType_string) &&
		((conv->src_field.data_type != string_type))) {
		/* Nothing but data movement required */
		    break;
	    }
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);
	    int loop_storage = 0;

	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#else
	    {
		dill_reg tmp_src, tmp_dest;
		ffs_getreg(c, &tmp_src, DILL_P,DILL_TEMP);
		ffs_getreg(c, &tmp_dest, DILL_P,DILL_TEMP);
		dill_movp(c, tmp_src, src_addr);
		dill_movp(c, tmp_dest, dest_addr);
		src_addr = tmp_src;
		dest_addr = tmp_dest;
	    }
#endif

	    if (((conv->subconversion == NULL)) &&
		!debug_code_generation()) {
		if (!ffs_getreg(c, &loop_var, DILL_I, DILL_TEMP))
		    gen_fatal("gen field convert out of registers BB \n");
		loop_var_type = DILL_TEMP;
	    } else {
		/* may call a subconversion in here, use VARs */
		if (!ffs_getreg(c, &loop_var, DILL_I, DILL_VAR))
		    gen_fatal("gen field convert out of registers CC\n");
		loop_var_type = DILL_VAR;
	    }
	    REG_DEBUG(("Getting1 %d as loop_var\n", _vrr(loop_var)));
	    dill_addpi(c, src_addr, src_addr, src_offset);
	    dill_addpi(c, dest_addr, dest_addr, dest_offset);

	    /* gen conversion loop */
	    loop_head = dill_alloc_label(c, NULL);
	    loop_end = dill_alloc_label(c, NULL);
	    dill_seti(c, loop_var, static_elements);
	    next = type_desc;
	    while (next->type == FMType_array) {
		if (next->static_size == 0) {
		    dill_reg addr_reg = (dill_reg)(intptr_t)conv_status->control_value;
		    dill_reg val;
		    int field = next->control_field_index;
		    ffs_getreg(c, &val, DILL_I, DILL_TEMP);
		    dill_ldii(c, val, addr_reg, field*sizeof(int));
		    dill_muli(c, loop_var, loop_var, val);
		}
		next = next->next;
	    }
	    if (!data_already_copied) {
		ssize_t base_delta = decode_size_delta(conv_status, conv, next);
		if (conv_status->global_conv->conversion_type == copy_dynamic_portion) {
		    int base_size = item_size(conv_status, conv, next);
		    dill_reg size;
		    ffs_getreg(c, &size, DILL_I, DILL_TEMP);
		    dill_mulii(c, size, loop_var, base_size);
#ifdef VERBOSE
		    dill_scallv(c, (void*)printf, "printf", "%P%p%p",
				"Calling Memcpy with args %p, %p, %d\n",dest_addr, src_addr, size);
#endif
		    dill_scallv(c, (void*)memcpy, "memcpy", "%p%p%i",
				dest_addr, src_addr, size);
		}
		if (base_delta != 0) {
		    dill_reg dest_src_ptr, delta;
		    ffs_getreg(c, &delta, DILL_I, DILL_TEMP);
		    ffs_getreg(c, &dest_src_ptr, DILL_I, DILL_TEMP);
		    dill_mulii(c, delta, loop_var, base_delta);
#ifdef VERBOSE
		    dill_scallv(c, (void*)printf, "printf", "%P%p",
				"Adjusting dest_pointer_base by %p\n", delta);
#endif
		    dill_ldpi(c, dest_src_ptr, rt_conv_status, FMOffset(RTConvStatus,dest_pointer_base));
		    dill_addp(c, dest_src_ptr, dest_src_ptr, delta);
		    dill_stpi(c, dest_src_ptr, rt_conv_status, FMOffset(RTConvStatus,dest_pointer_base));
		}
	    }

	    if (debug_code_generation()) {
		dill_scallv(c, (void*)printf, "printf", "%P%P%p",
			    "format %s, field Initial loopvar = %x\n", conv_status->global_conv->ioformat->body->format_name, loop_var);
	    }
	    
	    dill_bleii(c, loop_var, 0, loop_end);
	    dill_mark_label(c, loop_head);
#if defined(NOT) & defined(RAW)
	    if (!register_args) {
		/* store away loop var and free the reg */
		loop_storage = ffs_local(c, DILL_I);
		dill_stii(c, loop_var, dill_lp(c), loop_storage);
		REG_DEBUG(("Putting %d as loop_var\n", _vrr(loop_var)));
		ffs_putreg(c, loop_var, DILL_I);
	    }
#endif
	    generate_convert_field(c, conv_status, src_addr, 0, dest_addr, 0, 
				   rt_conv_status, conv, next, 
				   data_already_copied);
	    
	    (void)loop_var_type;  /* avoid warning */
#if defined(NOT) & defined(RAW)
	    /* generate end of loop */
	    if (!register_args) {
		/* store away loop var and free the reg */
		ffs_getreg(c, &loop_var, DILL_I, loop_var_type);
		REG_DEBUG(("Getting %d as loop_var\n", _vrr(loop_var)));
		dill_ldii(c, loop_var, dill_lp(c), loop_storage);
	    }
#endif
	    dill_subii(c, loop_var, loop_var, 1);
	    int array_of_pointers = 0;
	    if (conv->iovar->type_desc.type == FMType_pointer) {
		array_of_pointers = (conv->iovar->type_desc.next->next->type == FMType_pointer);
	    }
	    if (array_of_pointers) {
		dill_addpi(c, src_addr, src_addr, conv_status->src_pointer_size);
		dill_addpi(c, dest_addr, dest_addr, conv_status->target_pointer_size);
	    } else {
		dill_addpi(c, src_addr, src_addr, tmp_spec.size);
		dill_addpi(c, dest_addr, dest_addr, conv->dest_size);
	    }		
	    if (debug_code_generation()) {
		dill_scallv(c, (void*)printf, "printf", "%P%p%p%p",
			    "loopvar = %x, src %x, dest %x\n", loop_var,
			    src_addr, dest_addr);
	    }
	    dill_bgtii(c, loop_var, 0, loop_head);
	    dill_mark_label(c, loop_end);
	    ffs_putreg(c, loop_var, DILL_I);
	    REG_DEBUG(("Putting %d as loop_var\n", _vrr(loop_var)));
	
	    /* restore values of src_addr and dest_addr */
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	} else {
	    /* generate a call to transpose */
	    struct _FMgetFieldStruct tmp_spec = conv->src_field;
	    dill_reg dimens, dimen_reg, spec, spec_reg, tmp;
	    int source_column_major = 
		(conv->rc_swap == swap_source_column_major);
	    int dimen_count = conv->iovar->dimen_count;
	    FMdata_type dest_type = conv->src_field.data_type;

	    ffs_getreg(c, &dimen_reg, DILL_P, DILL_TEMP);
	    ffs_getreg(c, &tmp, DILL_I, DILL_TEMP);
	    ffs_getreg(c, &spec_reg, DILL_P, DILL_TEMP);
	    dimens = ffs_localb(c, dimen_count * sizeof(int));
	    spec = ffs_localb(c, sizeof(struct _FMgetFieldStruct));
	    dill_virtual_lea(c, dimen_reg, dimens);
	    dill_virtual_lea(c, spec_reg, spec);
	    FMTypeDesc *next = type_desc;
	    int i = 0;
	    while (next->type == FMType_array) {
		if (next->static_size != 0) {
		    dill_seti(c, tmp, next->static_size);
		} else {
		    dill_reg addr_reg = (dill_reg)(intptr_t)conv_status->control_value;
		    int field = next->control_field_index;
		    dill_ldii(c, tmp, addr_reg, field*sizeof(int));
		}
		dill_stii(c, tmp, dimen_reg, i * sizeof(int));
		i++;
		next = next->next;
	    }
	    dill_seti(c, tmp, 0);
	    dill_stii(c, tmp, dimen_reg, dimen_count * sizeof(int));
	    dill_stii(c, tmp, spec_reg, FMOffset(struct _IOgetFieldStruct *, offset));
	    for (i=4 ; i < sizeof(struct _IOgetFieldStruct); i+= 4) {
		dill_seti(c, tmp, *((int*)((char*)&tmp_spec + i)));
		dill_stii(c, tmp, spec_reg, i);
	    }
	    {
		dill_reg tmp_src, tmp_dest;
		ffs_getreg(c, &tmp_src, DILL_P,DILL_TEMP);
		ffs_getreg(c, &tmp_dest, DILL_P,DILL_TEMP);
		dill_addpi(c, tmp_src, src_addr, src_offset);
		dill_addpi(c, tmp_dest, dest_addr, dest_offset);
		src_addr = tmp_src;
		dest_addr = tmp_dest;
	    }
	    dill_scallv(c, (void*)transpose_array, "transpose_array",
			"%p%p%p%I%I%I%p", dimen_reg, src_addr, dest_addr,
			source_column_major, dest_type, conv->dest_size, spec_reg);
	}
	break;
    }
}